

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall
GlobOpt::TrackIntSpecializedAddSubConstant
          (GlobOpt *this,Instr *instr,AddSubConstantInfo *addSubConstantInfo,Value *dstValue,
          bool updateSourceBounds)

{
  int32 *key;
  ValueNumber VVar1;
  Opnd *pOVar2;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  _func_int **pp_Var4;
  Loop *pLVar5;
  ValueInfo *this_00;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  ValueNumber VVar10;
  int32 iVar11;
  undefined4 *puVar12;
  StackSym *pSVar13;
  RegOpnd *pRVar14;
  StackSym *pSVar15;
  Value *pVVar16;
  Instr *pIVar17;
  IntBounds *this_01;
  IntBoundedValueInfo *newValueInfo;
  AddSubConstantInfo *pAVar18;
  undefined1 local_70 [8];
  InductionVariable *inductionVariable;
  undefined4 *local_58;
  InductionVariable *local_50;
  InductionVariable *inductionVariable_1;
  AddSubConstantInfo *local_40;
  GlobOpt *local_38;
  
  local_40 = addSubConstantInfo;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c6,"(instr)","instr");
    if (!bVar7) goto LAB_004a3528;
    *puVar12 = 0;
  }
  if (dstValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c7,"(dstValue)","dstValue");
    if (!bVar7) goto LAB_004a3528;
    *puVar12 = 0;
  }
  if (local_40 == (AddSubConstantInfo *)0x0) {
    if ((*(uint *)&this->field_0xf4 & 0x40) == 0) {
      return;
    }
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
    if (this->prePassLoop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x375,"(IsLoopPrePass())","IsLoopPrePass()");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    if (instr->m_opcode != Ld_A) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x376,"(instr->m_opcode == Js::OpCode::Ld_A)",
                         "instr->m_opcode == Js::OpCode::Ld_A");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    pIVar17 = instr->m_prev;
    if ((0x33 < (ulong)pIVar17->m_opcode) ||
       ((0x820c000000000U >> ((ulong)pIVar17->m_opcode & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37b,
                         "(instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
      pIVar17 = instr->m_prev;
    }
    pOVar2 = pIVar17->m_dst;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    pp_Var4 = pOVar2[1]._vptr_Opnd;
    pOVar2 = instr->m_src1;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      local_38 = this;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
      this = local_38;
    }
    if (pp_Var4 != pOVar2[1]._vptr_Opnd) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37c,
                         "(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym)"
                         ,
                         "instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym"
                        );
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    pBVar3 = &((this->currentBlock->globOptData).inductionVariables)->
              super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    pOVar2 = instr->m_dst;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    bVar7 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (pBVar3,(uint *)(pOVar2[1]._vptr_Opnd + 2),(InductionVariable **)local_70,
                       (int *)&local_50);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37f,
                         "(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable))"
                         ,
                         "currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable)"
                        );
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    InductionVariable::SetSymValueNumber((InductionVariable *)local_70,dstValue->valueNumber);
    return;
  }
  if (local_40->srcSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cb,"(addSubConstantInfo->HasInfo())","addSubConstantInfo->HasInfo()");
    if (!bVar7) goto LAB_004a3528;
    *puVar12 = 0;
  }
  if ((this->field_0xf4 & 4) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cc,"(!ignoredIntOverflowForCurrentInstr)",
                       "!ignoredIntOverflowForCurrentInstr");
    if (!bVar7) goto LAB_004a3528;
    *puVar12 = 0;
  }
  if ((this->prePassLoop != (Loop *)0x0) && (bVar7 = DoBoundCheckHoist(this), bVar7)) {
    if ((0x33 < (ulong)instr->m_opcode) ||
       (local_38 = this, (0x820c000000000U >> ((ulong)instr->m_opcode & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      local_38 = this;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x2d8,
                         "(instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    pOVar2 = instr->m_dst;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    pAVar18 = local_40;
    pSVar15 = (StackSym *)pOVar2[1]._vptr_Opnd;
    pSVar13 = AddSubConstantInfo::SrcSym(local_40);
    inductionVariable_1 = (InductionVariable *)pSVar15;
    if (pSVar13 == pSVar15) {
LAB_004a2d7e:
      pVVar16 = AddSubConstantInfo::SrcValue(pAVar18);
    }
    else {
      pIVar17 = instr->m_prev;
      if (pIVar17 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x2e8,"(prevInstr)","prevInstr");
        if (!bVar7) goto LAB_004a3528;
        *puVar12 = 0;
      }
      if ((pIVar17->m_opcode != Conv_Num) ||
         (OVar8 = IR::Opnd::GetKind(pIVar17->m_src1), OVar8 != OpndKindReg)) {
LAB_004a2c55:
        pIVar17 = instr->m_next;
        if (pIVar17 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x2f6,"(nextInstr)","nextInstr");
          if (!bVar7) goto LAB_004a3528;
          *puVar12 = 0;
        }
        this = local_38;
        if ((pIVar17->m_opcode == Ld_A) &&
           (OVar8 = IR::Opnd::GetKind(pIVar17->m_src1), OVar8 == OpndKindReg)) {
          pOVar2 = pIVar17->m_src1;
          OVar8 = IR::Opnd::GetKind(pOVar2);
          if (OVar8 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar7) goto LAB_004a3528;
            *puVar12 = 0;
          }
          this = local_38;
          if ((InductionVariable *)pOVar2[1]._vptr_Opnd == inductionVariable_1) {
            pSVar15 = AddSubConstantInfo::SrcSym(local_40);
            pRVar14 = IR::Opnd::AsRegOpnd(pIVar17->m_dst);
            inductionVariable_1 = (InductionVariable *)pSVar15;
            if (pRVar14->m_sym == pSVar15) {
              this->field_0xf4 = this->field_0xf4 | 0x40;
              pAVar18 = local_40;
              goto LAB_004a2d7e;
            }
          }
        }
        goto LAB_004a3339;
      }
      pOVar2 = pIVar17->m_src1;
      OVar8 = IR::Opnd::GetKind(pOVar2);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_58 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_004a3528;
        *local_58 = 0;
      }
      if ((InductionVariable *)pOVar2[1]._vptr_Opnd != inductionVariable_1) goto LAB_004a2c55;
      pRVar14 = IR::Opnd::AsRegOpnd(pIVar17->m_dst);
      pSVar15 = pRVar14->m_sym;
      pSVar13 = AddSubConstantInfo::SrcSym(local_40);
      if (pSVar15 != pSVar13) goto LAB_004a2c55;
      pVVar16 = GlobOptBlockData::FindValue
                          (&local_38->currentBlock->globOptData,(Sym *)inductionVariable_1);
      if (pVVar16 == (Value *)0x0) {
        TrackIntSpecializedAddSubConstant();
        goto LAB_004a3528;
      }
    }
    VVar1 = pVVar16->valueNumber;
    pBVar3 = &((local_38->currentBlock->globOptData).inductionVariables)->
              super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    if (pBVar3 == (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x318,"(inductionVariables)","inductionVariables");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    key = &(inductionVariable_1->changeBounds).upperBound;
    bVar7 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>(pBVar3,(uint *)key,&local_50,(int *)local_70);
    if (bVar7) {
      bVar7 = InductionVariable::IsChangeDeterminate(local_50);
      if (bVar7) {
        VVar10 = InductionVariable::SymValueNumber(local_50);
        if (VVar1 == VVar10) {
          InductionVariable::SetSymValueNumber(local_50,dstValue->valueNumber);
          this = local_38;
          if (local_38->prePassLoop == local_38->currentBlock->loop) {
            iVar11 = AddSubConstantInfo::Offset(local_40);
            bVar7 = InductionVariable::Add(local_50,iVar11);
            this = local_38;
            if (!bVar7) {
              local_38->field_0xf4 = local_38->field_0xf4 & 0xbf;
            }
          }
          goto LAB_004a3339;
        }
        InductionVariable::SetChangeIsIndeterminate(local_50);
      }
LAB_004a3327:
      local_38->field_0xf4 = local_38->field_0xf4 & 0xbf;
      this = local_38;
    }
    else {
      pLVar5 = local_38->currentBlock->loop;
      if (local_38->prePassLoop == pLVar5) {
        pVVar16 = GlobOptBlockData::FindValue
                            (&pLVar5->landingPad->globOptData,(Sym *)inductionVariable_1);
        if (((pVVar16 == (Value *)0x0) || (VVar1 != pVVar16->valueNumber)) ||
           (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                              (local_38->currentBlock->loop->symsDefInLoop,*key), BVar9 != '\0'))
        goto LAB_004a3327;
        VVar1 = dstValue->valueNumber;
        iVar11 = AddSubConstantInfo::Offset(local_40);
        InductionVariable::InductionVariable
                  ((InductionVariable *)local_70,(StackSym *)inductionVariable_1,VVar1,iVar11);
        JsUtil::
        BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add((BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)pBVar3,(InductionVariable *)local_70);
        this = local_38;
      }
      else {
        local_38->field_0xf4 = local_38->field_0xf4 & 0xbf;
        this = local_38;
      }
    }
  }
LAB_004a3339:
  pAVar18 = local_40;
  if (updateSourceBounds && this->prePassLoop == (Loop *)0x0) {
    AddSubConstantInfo::Offset(local_40);
    pVVar16 = AddSubConstantInfo::SrcValue(pAVar18);
    this_00 = pVVar16->valueInfo;
    bVar7 = ValueType::IsInt(&this_00->super_ValueType);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x355,"(valueInfo->IsInt())","valueInfo->IsInt()");
      if (!bVar7) goto LAB_004a3528;
      *puVar12 = 0;
    }
    local_70._0_4_ = 0;
    local_70._4_4_ = 0;
    bVar7 = ValueInfo::TryGetIntConstantBounds(this_00,(IntConstantBounds *)local_70,false);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x357,"(valueInfo->TryGetIntConstantBounds(&constantBounds))",
                         "valueInfo->TryGetIntConstantBounds(&constantBounds)");
      if (!bVar7) {
LAB_004a3528:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar12 = 0;
    }
    bVar7 = ValueInfo::HasIntConstantValue(dstValue->valueInfo,false);
    this_01 = GetIntBoundsToUpdate(this,this_00,(IntConstantBounds *)local_70,true,bVar7,true,true);
    if (this_01 != (IntBounds *)0x0) {
      VVar1 = pVVar16->valueNumber;
      local_38 = (GlobOpt *)this_00;
      iVar11 = AddSubConstantInfo::Offset(local_40);
      local_40 = (AddSubConstantInfo *)pVVar16;
      IntBounds::SetLowerBound(this_01,VVar1,dstValue,-iVar11,true);
      IntBounds::SetUpperBound(this_01,VVar1,dstValue,-iVar11,true);
      newValueInfo = NewIntBoundedValueInfo(this,(ValueInfo *)local_38,this_01);
      ChangeValueInfo(this,(BasicBlock *)0x0,(Value *)local_40,&newValueInfo->super_ValueInfo,false,
                      false);
    }
  }
  return;
}

Assistant:

void GlobOpt::TrackIntSpecializedAddSubConstant(
    IR::Instr *const instr,
    const AddSubConstantInfo *const addSubConstantInfo,
    Value *const dstValue,
    const bool updateSourceBounds)
{
    Assert(instr);
    Assert(dstValue);

    if(addSubConstantInfo)
    {
        Assert(addSubConstantInfo->HasInfo());
        Assert(!ignoredIntOverflowForCurrentInstr);
        do
        {
            if(!IsLoopPrePass() || !DoBoundCheckHoist())
            {
                break;
            }

            Assert(
                instr->m_opcode == Js::OpCode::Incr_A ||
                instr->m_opcode == Js::OpCode::Decr_A ||
                instr->m_opcode == Js::OpCode::Add_A ||
                instr->m_opcode == Js::OpCode::Sub_A);

            StackSym *sym = instr->GetDst()->AsRegOpnd()->m_sym;
            bool isPostfixIncDecPattern = false;
            if(addSubConstantInfo->SrcSym() != sym)
            {
                // Check for the following patterns.
                //
                // This pattern is used for postfix inc/dec operators:
                //     s2 = Conv_Num s1
                //     s1 = Inc s2
                //
                // This pattern is used for prefix inc/dec operators:
                //     s2 = Inc s1
                //     s1 = Ld s2
                IR::Instr *const prevInstr = instr->m_prev;
                Assert(prevInstr);
                if(prevInstr->m_opcode == Js::OpCode::Conv_Num &&
                    prevInstr->GetSrc1()->IsRegOpnd() &&
                    prevInstr->GetSrc1()->AsRegOpnd()->m_sym == sym &&
                    prevInstr->GetDst()->AsRegOpnd()->m_sym == addSubConstantInfo->SrcSym())
                {
                    // s2 will get a new value number, since Conv_Num cannot transfer in the prepass. For the purposes of
                    // induction variable tracking however, it doesn't matter, so record this case and use s1's value in the
                    // current block.
                    isPostfixIncDecPattern = true;
                }
                else
                {
                    IR::Instr *const nextInstr = instr->m_next;
                    Assert(nextInstr);
                    if(nextInstr->m_opcode != Js::OpCode::Ld_A ||
                        !nextInstr->GetSrc1()->IsRegOpnd() ||
                        nextInstr->GetSrc1()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }
                    sym = addSubConstantInfo->SrcSym();
                    if(nextInstr->GetDst()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }

                    // In the prefix inc/dec pattern, the result of Ld currently gets a new value number, which will cause the
                    // induction variable info to become indeterminate. Indicate that the value number should be updated in the
                    // induction variable info.
                    // Consider: Remove this once loop prepass value transfer scheme is fixed
                    updateInductionVariableValueNumber = true;
                }
            }

            // Track induction variable info
            ValueNumber srcValueNumber;
            if(isPostfixIncDecPattern)
            {
                Value *const value = this->currentBlock->globOptData.FindValue(sym);
                Assert(value);
                srcValueNumber = value->GetValueNumber();
            }
            else
            {
                srcValueNumber = addSubConstantInfo->SrcValue()->GetValueNumber();
            }
            InductionVariableSet *const inductionVariables = currentBlock->globOptData.inductionVariables;
            Assert(inductionVariables);
            InductionVariable *inductionVariable;
            if(!inductionVariables->TryGetReference(sym->m_id, &inductionVariable))
            {
                // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated
                // for use by the parent loop, so changes in the current loop have already been tracked.
                if(prePassLoop != currentBlock->loop)
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }

                // Ensure that the sym is live in the landing pad, and that its value has not changed in an unknown way yet
                Value *const landingPadValue = currentBlock->loop->landingPad->globOptData.FindValue(sym);
                if(!landingPadValue || srcValueNumber != landingPadValue->GetValueNumber() || currentBlock->loop->symsDefInLoop->Test(sym->m_id))
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }
                inductionVariables->Add(
                    InductionVariable(sym, dstValue->GetValueNumber(), addSubConstantInfo->Offset()));
                break;
            }

            if(!inductionVariable->IsChangeDeterminate())
            {
                updateInductionVariableValueNumber = false;
                break;
            }

            if(srcValueNumber != inductionVariable->SymValueNumber())
            {
                // The sym's value has changed since the last time induction variable info was recorded for it. Due to the
                // unknown change, mark the info as indeterminate.
                inductionVariable->SetChangeIsIndeterminate();
                updateInductionVariableValueNumber = false;
                break;
            }

            // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated for
            // use by the parent loop, so changes in the current loop have already been tracked. Induction variable value
            // numbers are updated as changes occur, but their change bounds are preserved from the first prepass over the loop.
            inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
            if(prePassLoop != currentBlock->loop)
            {
                break;
            }

            if(!inductionVariable->Add(addSubConstantInfo->Offset()))
            {
                updateInductionVariableValueNumber = false;
            }
        } while(false);

        if(!this->IsLoopPrePass() && updateSourceBounds && addSubConstantInfo->Offset() != IntConstMin)
        {
            // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track
            // that it is equal to (the value of 'a') + 2. That part has been done above. Similarly, the value of 'a' should
            // also track that it is equal to (the value of 'b') - 2.
            Value *const value = addSubConstantInfo->SrcValue();
            const ValueInfo *const valueInfo = value->GetValueInfo();
            Assert(valueInfo->IsInt());
            IntConstantBounds constantBounds;
            AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
            IntBounds *const bounds =
                GetIntBoundsToUpdate(
                    valueInfo,
                    constantBounds,
                    true,
                    dstValue->GetValueInfo()->HasIntConstantValue(),
                    true,
                    true);
            if(bounds)
            {
                const ValueNumber valueNumber = value->GetValueNumber();
                const int32 dstOffset = -addSubConstantInfo->Offset();
                bounds->SetLowerBound(valueNumber, dstValue, dstOffset, true);
                bounds->SetUpperBound(valueNumber, dstValue, dstOffset, true);
                ChangeValueInfo(nullptr, value, NewIntBoundedValueInfo(valueInfo, bounds));
            }
        }
        return;
    }

    if(!updateInductionVariableValueNumber)
    {
        return;
    }

    // See comment above where this is set to true
    // Consider: Remove this once loop prepass value transfer scheme is fixed
    updateInductionVariableValueNumber = false;

    Assert(IsLoopPrePass());
    Assert(instr->m_opcode == Js::OpCode::Ld_A);
    Assert(
        instr->m_prev->m_opcode == Js::OpCode::Incr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Decr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Add_A ||
        instr->m_prev->m_opcode == Js::OpCode::Sub_A);
    Assert(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym);

    InductionVariable *inductionVariable;
    AssertVerify(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable));
    inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
}